

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::ScratchAllocator::allocate_raw(ScratchAllocator *this,size_t size,size_t alignment)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  uchar *puVar6;
  void *ret;
  size_t required_size;
  size_t offset;
  value_type *block;
  size_t alignment_local;
  size_t size_local;
  ScratchAllocator *this_local;
  
  bVar1 = std::
          vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
          ::empty(&this->impl->blocks);
  if (bVar1) {
    Impl::add_block(this->impl,size + alignment);
  }
  pvVar2 = std::
           vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
           ::back(&this->impl->blocks);
  uVar3 = (pvVar2->offset + alignment) - 1 & (alignment - 1 ^ 0xffffffffffffffff);
  uVar4 = uVar3 + size;
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pvVar2->blob);
  if (sVar5 < uVar4) {
    Impl::add_block(this->impl,size + alignment);
    this_local = (ScratchAllocator *)allocate_raw(this,size,alignment);
  }
  else {
    puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&pvVar2->blob);
    this_local = (ScratchAllocator *)(puVar6 + uVar3);
    pvVar2->offset = uVar4;
  }
  return this_local;
}

Assistant:

void *ScratchAllocator::allocate_raw(size_t size, size_t alignment)
{
	if (impl->blocks.empty())
		impl->add_block(size + alignment);

	auto &block = impl->blocks.back();

	size_t offset = (block.offset + alignment - 1) & ~(alignment - 1);
	size_t required_size = offset + size;
	if (required_size <= block.blob.size())
	{
		void *ret = block.blob.data() + offset;
		block.offset = required_size;
		return ret;
	}

	impl->add_block(size + alignment);
	return allocate_raw(size, alignment);
}